

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::TreeConvert(InnerMap *this,size_type b)

{
  void **ppvVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  map<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
  *tree;
  size_type sVar4;
  size_type sVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  ppvVar1 = this->table_;
  pvVar2 = ppvVar1[b];
  if (((pvVar2 != (void *)0x0) && (pvVar2 == ppvVar1[b ^ 1])) ||
     (ppvVar1[b ^ 1] == pvVar2 && ppvVar1[b ^ 1] != (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x3db);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_68._0_8_ = (this->alloc_).arena_;
  tree = Arena::
         Create<std::map<std::reference_wrapper<std::__cxx11::string_const>,void*,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                   ((Arena *)local_68._0_8_,(less *)&local_69,
                    (MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>
                     *)&local_68);
  sVar4 = CopyListToTree(this,b,tree);
  sVar5 = CopyListToTree(this,b ^ 1,tree);
  if (sVar5 + sVar4 != (tree->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x3e0);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (count) == (tree->size()): ")
    ;
    internal::LogFinisher::operator=(&local_69,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  this->table_[b ^ 1] = tree;
  this->table_[b] = tree;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      Tree* tree =
          Arena::Create<Tree>(alloc_.arena(), typename Tree::key_compare(),
                              typename Tree::allocator_type(alloc_));
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }